

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O2

void dequantize_row_iq2_xs(block_iq2_xs *x,float *y,int64_t k)

{
  float fVar1;
  byte bVar2;
  ushort uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int l;
  ulong uVar8;
  float fVar9;
  float local_38 [2];
  
  lVar5 = 0;
  lVar4 = k / 0x100;
  if (k / 0x100 < 1) {
    lVar4 = lVar5;
  }
  for (; lVar5 != lVar4; lVar5 = lVar5 + 1) {
    fVar1 = ggml_table_f32_f16[x[lVar5].d];
    for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
      local_38[0] = ((float)(x[lVar5].scales[lVar7] & 0xf) + 0.5) * fVar1 * 0.25;
      local_38[1] = ((float)(x[lVar5].scales[lVar7] >> 4) + 0.5) * fVar1 * 0.25;
      for (uVar8 = 0; uVar8 != 4; uVar8 = uVar8 + 1) {
        uVar3 = x[lVar5].qs[uVar8 | lVar7 * 4];
        bVar2 = ""[uVar3 >> 9];
        for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 1) {
          fVar9 = (float)*(byte *)((long)iq2xs_grid + lVar6 + (ulong)(uVar3 & 0x1ff) * 8) *
                  local_38[uVar8 >> 1 & 0x7fffffff];
          if ((kmask_iq2xs[lVar6] & bVar2) != 0) {
            fVar9 = -fVar9;
          }
          y[lVar6] = fVar9;
        }
        y = y + 8;
      }
    }
  }
  return;
}

Assistant:

void dequantize_row_iq2_xs(const block_iq2_xs * GGML_RESTRICT x, float * GGML_RESTRICT y, int64_t k) {
    assert(k % QK_K == 0);
    const int64_t nb = k / QK_K;

    float db[2];

    for (int i = 0; i < nb; i++) {

        const float d = GGML_FP16_TO_FP32(x[i].d);

        for (int ib32 = 0; ib32 < QK_K/32; ++ib32) {
            db[0] = d * (0.5f + (x[i].scales[ib32] & 0xf)) * 0.25f;
            db[1] = d * (0.5f + (x[i].scales[ib32] >>  4)) * 0.25f;
            for (int l = 0; l < 4; ++l) {
                const uint8_t * grid = (const uint8_t *)(iq2xs_grid + (x[i].qs[4*ib32 + l] & 511));
                const uint8_t  signs = ksigns_iq2xs[x[i].qs[4*ib32 + l] >> 9];
                for (int j = 0; j < 8; ++j) {
                    y[j] = db[l/2] * grid[j] * (signs & kmask_iq2xs[j] ? -1.f : 1.f);
                }
                y += 8;
            }
        }
    }
}